

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O1

err_t cmdFilePrefixRead(octet *prefix,size_t *count,char *name,size_t offset)

{
  bool bVar1;
  octet *dest;
  ulong *puVar2;
  bool_t bVar3;
  file_t file;
  size_t sVar4;
  octet *der;
  size_t sVar5;
  size_t sVar6;
  err_t eVar7;
  err_t eVar8;
  ulong uVar9;
  size_t len;
  u32 tag;
  size_t local_50;
  octet *local_48;
  ulong *local_40;
  u32 local_34;
  
  file = fileOpen(name,"rb");
  if (file == (file_t)0x0) {
    return 0xcb;
  }
  sVar4 = fileSize(file);
  uVar9 = sVar4 - offset;
  if (sVar4 == 0xffffffffffffffff || (sVar4 < offset || uVar9 == 0)) {
    eVar7 = 0xd1;
    if (offset < sVar4) {
      eVar7 = 0;
    }
    eVar8 = 0xcf;
    if (sVar4 != 0xffffffffffffffff) {
      eVar8 = eVar7;
    }
    goto LAB_00104913;
  }
  local_48 = prefix;
  local_40 = count;
  der = (octet *)blobCreate(0x10);
  if (der == (octet *)0x0) goto LAB_0010491d;
  sVar6 = 0x10;
  if (uVar9 < 0x10) {
    sVar6 = uVar9;
  }
  eVar8 = 0;
  bVar3 = fileSeek(file,offset,0);
  if (bVar3 == 0) {
LAB_001047e9:
    eVar8 = 0xcf;
    bVar1 = false;
  }
  else {
    sVar5 = fileRead2(der,sVar6,file);
    bVar1 = true;
    if (sVar5 != sVar6) goto LAB_001047e9;
  }
  if (bVar1) {
    sVar6 = derTLDec(&local_34,&local_50,der,sVar6);
    if ((sVar6 == 0xffffffffffffffff) || (sVar4 < sVar6 + offset + local_50)) {
      eVar8 = 0x132;
      bVar1 = false;
    }
    else {
      eVar8 = 0;
      bVar1 = true;
    }
    if (bVar1) {
      sVar6 = sVar6 + local_50;
      blobClose(der);
      der = (octet *)blobCreate(sVar6);
      if (der == (octet *)0x0) {
LAB_0010491d:
        fileClose(file);
        return 0x6e;
      }
      eVar8 = 0;
      bVar3 = fileSeek(file,offset,0);
      if (bVar3 == 0) {
LAB_001048aa:
        eVar8 = 0xcf;
        bVar1 = false;
      }
      else {
        sVar4 = fileRead2(der,sVar6,file);
        bVar1 = true;
        if (sVar4 != sVar6) goto LAB_001048aa;
      }
      puVar2 = local_40;
      dest = local_48;
      if (bVar1) {
        bVar3 = fileClose(file);
        if (bVar3 == 0) {
          blobClose(der);
          return 0x67;
        }
        bVar3 = derIsValid3(der,sVar6);
        if (bVar3 != 0) {
          eVar7 = 0;
          if ((dest != (octet *)0x0) && (eVar7 = 0x6e, sVar6 <= *puVar2)) {
            memCopy(dest,der,sVar6);
            eVar7 = 0;
          }
          *puVar2 = sVar6;
          blobClose(der);
          return eVar7;
        }
        blobClose(der);
        return 0x132;
      }
    }
  }
  blobClose(der);
LAB_00104913:
  fileClose(file);
  return eVar8;
}

Assistant:

err_t cmdFilePrefixRead(octet* prefix, size_t* count, const char* name,
	size_t offset)
{
	const size_t buf_size = 16;
	err_t code;
	file_t file;
	size_t size;
	void* buf;
	size_t c;
	u32 tag;
	size_t len;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(count, O_PER_S));
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (offset >= size)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// прочитать заголовок префикса
	c = MIN2(buf_size, size - offset);
	if (!fileSeek(file, offset, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// определить длину префикса
	c = derTLDec(&tag, &len, buf, c);
	if (c == SIZE_MAX || offset + c + len > size)
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	c += len;
	// прочитать префикс
	cmdBlobClose(buf);
	code = cmdBlobCreate(buf, c);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	if (!fileSeek(file, offset, SEEK_SET) ||
		fileRead2(buf, c, file) != c)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdBlobClose(buf), cmdFileClose(file)));
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// проверить префикс
	if (!derIsValid3(buf, c))
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// возвратить префикс и его длину
	if (prefix)
	{
		ASSERT(memIsValid(prefix, *count));
		if (*count < c)
			code = ERR_OUTOFMEMORY;
		else
			memCopy(prefix, buf, c);
	}
	*count = c;
	// завершить
	cmdBlobClose(buf);
	return code;
}